

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

cni_holder_base *
cs_impl::cni::construct_helper<void(cs_impl::fiber::Channel<cs_impl::any>::*)()>::
_construct<void(cs_impl::fiber::Channel<cs_impl::any>::*&)(),void,cs_impl::fiber::Channel<cs_impl::any>&>
          (offset_in_Channel<cs_impl::any>_to_subr *val,
          _func_void_Channel<cs_impl::any>_ptr *target_function)

{
  cni_holder<void_(cs_impl::fiber::Channel<cs_impl::any>::*)(),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
  *this;
  
  this = (cni_holder<void_(cs_impl::fiber::Channel<cs_impl::any>::*)(),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
          *)operator_new(0x28);
  cni_holder<void_(cs_impl::fiber::Channel<cs_impl::any>::*)(),_void_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
  ::cni_holder(this,val);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}